

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.h
# Opt level: O0

char * __thiscall cmMakefile::GetIncludeRegularExpression(cmMakefile *this)

{
  char *pcVar1;
  allocator<char> local_31;
  string local_30;
  cmMakefile *local_10;
  cmMakefile *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"INCLUDE_REGULAR_EXPRESSION",&local_31);
  pcVar1 = GetProperty(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  return pcVar1;
}

Assistant:

const char* GetIncludeRegularExpression() const
  {
    return this->GetProperty("INCLUDE_REGULAR_EXPRESSION");
  }